

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void Parser::MapBindIdentifierFromElement<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>
               (ParseNodePtr elementNode,anon_class_8_1_ae4198de handler)

{
  undefined1 *puVar1;
  Symbol *this;
  IdentPtr pIVar2;
  code *pcVar3;
  OpCode OVar4;
  bool bVar5;
  ParseNodeBin *pPVar6;
  ParseNodeVar *pPVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  
  OVar4 = elementNode->nop;
  if (OVar4 == knopEllipsis) {
    pPVar6 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (OVar4 != knopAsg) goto LAB_0082ba21;
    pPVar6 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar6->pnode1;
  OVar4 = elementNode->nop;
LAB_0082ba21:
  if ((OVar4 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<PreVisitCatch(ParseNodeCatch*,ByteCodeGenerator*)::__0>(elementNode,handler);
    return;
  }
  if ((byte)(OVar4 + ~knopList) < 3) {
    pPVar7 = ParseNode::AsParseNodeVar(elementNode);
    this = pPVar7->sym;
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
    if (bVar5) {
      pPVar7 = ParseNode::AsParseNodeVar(elementNode);
      pIVar2 = pPVar7->pid;
      pcVar8 = Symbol::GetSymbolTypeName(this);
      Output::Print(L"current context has declared catch var %s of type %s\n",&pIVar2->field_0x22,
                    pcVar8);
    }
    puVar1 = &this->field_0x42;
    *puVar1 = *puVar1 | 0x42;
  }
  else if (OVar4 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }